

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O0

int __thiscall WaitableSafeQueue<int>::pop(WaitableSafeQueue<int> *this)

{
  bool bVar1;
  int iVar2;
  int val;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lk;
  WaitableSafeQueue<int> *this_local;
  
  lk._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m_mtx);
  while( true ) {
    bVar1 = SafeQueue<int>::empty((SafeQueue<int> *)this);
    if (!bVar1) break;
    std::condition_variable::wait((unique_lock *)&this->m_cond);
  }
  iVar2 = SafeQueue<int>::pop((SafeQueue<int> *)this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return iVar2;
}

Assistant:

T pop() override
    {
        std::unique_lock lk(m_mtx);

        while (SafeQueue<T>::empty())
        {
            m_cond.wait(lk);
        }

        T val = SafeQueue<T>::pop();

        return val;
    }